

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> * __thiscall
adios2::profiling::JSONProfiler::AggregateProfilingJSON
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,JSONProfiler *this,
          string *rankLog)

{
  pointer puVar1;
  long lVar2;
  allocator local_81;
  vector<unsigned_long,_std::allocator<unsigned_long>_> rankLogsSizes;
  string footer;
  string header;
  
  helper::Comm::GatherValues<unsigned_long>(&rankLogsSizes,this->m_Comm,rankLog->_M_string_length,0)
  ;
  std::vector<char,_std::allocator<char>_>::vector
            (__return_storage_ptr__,3,(allocator_type *)&header);
  std::__cxx11::string::string((string *)&header,"[\n",(allocator *)&footer);
  std::__cxx11::string::string((string *)&footer,"\n]\n",&local_81);
  if (this->m_RankMPI == 0) {
    lVar2 = 0;
    for (puVar1 = rankLogsSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar1 != rankLogsSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
      lVar2 = lVar2 + *puVar1;
    }
    lVar2 = lVar2 + -2;
    std::vector<char,_std::allocator<char>_>::resize
              (__return_storage_ptr__,header._M_string_length + lVar2 + footer._M_string_length);
    if (header._M_string_length != 0) {
      memmove((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start,header._M_dataplus._M_p,header._M_string_length);
      goto LAB_005e7e55;
    }
  }
  else {
    lVar2 = -2;
  }
  header._M_string_length = 0;
LAB_005e7e55:
  helper::Comm::GathervArrays<char>
            (this->m_Comm,(rankLog->_M_dataplus)._M_p,rankLog->_M_string_length,
             rankLogsSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start,
             (long)rankLogsSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)rankLogsSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,
             (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start + header._M_string_length,0);
  if ((this->m_RankMPI == 0) && (footer._M_string_length != 0)) {
    memmove((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start + lVar2 + header._M_string_length,
            footer._M_dataplus._M_p,footer._M_string_length);
  }
  std::__cxx11::string::~string((string *)&footer);
  std::__cxx11::string::~string((string *)&header);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&rankLogsSizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> JSONProfiler::AggregateProfilingJSON(const std::string &rankLog) const
{
    // Gather sizes
    const size_t rankLogSize = rankLog.size();
    std::vector<size_t> rankLogsSizes = m_Comm.GatherValues(rankLogSize);

    // Gatherv JSON per rank
    std::vector<char> profilingJSON(3);
    const std::string header("[\n");
    const std::string footer("\n]\n");
    size_t gatheredSize = 0;
    size_t position = 0;

    if (m_RankMPI == 0) // pre-allocate in destination
    {
        gatheredSize = std::accumulate(rankLogsSizes.begin(), rankLogsSizes.end(), size_t(0));

        profilingJSON.resize(gatheredSize + header.size() + footer.size() - 2);
        adios2::helper::CopyToBuffer(profilingJSON, position, header.c_str(), header.size());
    }

    m_Comm.GathervArrays(rankLog.c_str(), rankLog.size(), rankLogsSizes.data(),
                         rankLogsSizes.size(), &profilingJSON[position]);

    if (m_RankMPI == 0) // add footer to close JSON
    {
        position += gatheredSize - 2;
        helper::CopyToBuffer(profilingJSON, position, footer.c_str(), footer.size());
    }

    return profilingJSON;
}